

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.h
# Opt level: O2

bool __thiscall
CompareTxMemPoolEntryByAncestorFee::operator()
          (CompareTxMemPoolEntryByAncestorFee *this,CTxMemPoolEntry *a,CTxMemPoolEntry *b)

{
  bool bVar1;
  long in_FS_OFFSET;
  double b_size;
  double b_mod_fee;
  double a_size;
  double a_mod_fee;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GetModFeeAndSize<CTxMemPoolEntry>(this,a,&local_40,&local_48);
  GetModFeeAndSize<CTxMemPoolEntry>(this,b,&local_50,&local_58);
  local_40 = local_40 * local_58;
  local_48 = local_48 * local_50;
  if ((local_40 != local_48) || (NAN(local_40) || NAN(local_48))) {
    bVar1 = local_48 < local_40;
  }
  else {
    bVar1 = transaction_identifier<false>::operator<
                      (&((a->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->hash,
                       &((b->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->hash);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const T& a, const T& b) const
    {
        double a_mod_fee, a_size, b_mod_fee, b_size;

        GetModFeeAndSize(a, a_mod_fee, a_size);
        GetModFeeAndSize(b, b_mod_fee, b_size);

        // Avoid division by rewriting (a/b > c/d) as (a*d > c*b).
        double f1 = a_mod_fee * b_size;
        double f2 = a_size * b_mod_fee;

        if (f1 == f2) {
            return a.GetTx().GetHash() < b.GetTx().GetHash();
        }
        return f1 > f2;
    }